

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

int __thiscall glcts::anon_unknown_0::UniformType::abs(UniformType *this,int __x)

{
  int iVar1;
  
  iVar1 = (int)this;
  if (iVar1 < 0x1406) {
    if (iVar1 == 0x1404) {
      return 0x19fade4;
    }
    if (iVar1 == 0x1405) {
      return 0x1ad4d72;
    }
  }
  else if ((iVar1 == 0x1406) || (iVar1 == 0x82e6)) {
    return 0x1b2b983;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                ,0x14e,"const char *glcts::(anonymous namespace)::UniformType::abs() const");
}

Assistant:

const char* abs() const
	{
		switch (baseType)
		{
		case GL_FLOAT:
		case GL_SAMPLER:
			return "0.1";
		case GL_UNSIGNED_INT:
			return "0u";
		case GL_INT:
			return "0";
		default:
			assert(0);
			return "";
		}
	}